

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPasvDataTransfer.cpp
# Opt level: O0

void __thiscall CPasvDataTransfer::Execute(CPasvDataTransfer *this)

{
  socklen_t local_28;
  int ret;
  socklen_t len;
  sockaddr_in clientaddr;
  int clientsock;
  CPasvDataTransfer *this_local;
  
  local_28 = 0x10;
  unique0x100000a7 = this;
  clientaddr.sin_zero._0_4_ = accept(this->m_Sock,(sockaddr *)&ret,&local_28);
  this->m_CliSock = clientaddr.sin_zero._0_4_;
  sem_wait((sem_t *)&this->m_Signal);
  DispatchCommand(this,clientaddr.sin_zero._0_4_);
  close(clientaddr.sin_zero._0_4_);
  if (this != (CPasvDataTransfer *)0x0) {
    ~CPasvDataTransfer(this);
    operator_delete(this);
  }
  return;
}

Assistant:

void CPasvDataTransfer::Execute() {
    int clientsock;
    struct sockaddr_in clientaddr;

    socklen_t len = sizeof(clientaddr);

    clientsock = accept(m_Sock, (struct sockaddr *)&clientaddr, &len);
    m_CliSock = clientsock;
    sem_wait(&m_Signal);
    int ret = DispatchCommand(clientsock);

    close(clientsock);
    delete this;
}